

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

void __thiscall Json::StyledWriter::indent(StyledWriter *this)

{
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct((ulong)local_30,(char)this->indentSize_);
  std::__cxx11::string::append((string *)&this->indentString_);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void 
StyledWriter::indent()
{
   indentString_ += std::string( indentSize_, ' ' );
}